

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerGLSL::args_will_forward
          (CompilerGLSL *this,uint32_t id,uint32_t *args,uint32_t num_args,bool pure)

{
  size_t sVar1;
  uint *puVar2;
  bool bVar3;
  bool bVar4;
  iterator iVar5;
  long lVar6;
  ulong uVar7;
  key_type_conflict local_34;
  
  iVar5 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->super_Compiler).forced_temporaries._M_h,&local_34);
  if (iVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    if (num_args != 0) {
      uVar7 = 0;
      do {
        bVar3 = should_forward(this,args[uVar7]);
        if (!bVar3) goto LAB_0027be65;
        uVar7 = uVar7 + 1;
      } while (num_args != uVar7);
    }
    bVar3 = true;
    if (!pure) {
      sVar1 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.buffer_size;
      if (sVar1 != 0) {
        puVar2 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.ptr;
        lVar6 = 0;
        do {
          bVar4 = should_forward(this,*(uint32_t *)((long)puVar2 + lVar6));
          if (!bVar4) goto LAB_0027be65;
          lVar6 = lVar6 + 4;
        } while (sVar1 << 2 != lVar6);
      }
      sVar1 = (this->super_Compiler).aliased_variables.super_VectorView<unsigned_int>.buffer_size;
      if (sVar1 != 0) {
        puVar2 = (this->super_Compiler).aliased_variables.super_VectorView<unsigned_int>.ptr;
        lVar6 = 0;
        do {
          bVar3 = should_forward(this,*(uint32_t *)((long)puVar2 + lVar6));
          if (!bVar3) {
            return bVar3;
          }
          bVar4 = sVar1 * 4 + -4 != lVar6;
          lVar6 = lVar6 + 4;
        } while (bVar4);
      }
    }
  }
  else {
LAB_0027be65:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CompilerGLSL::args_will_forward(uint32_t id, const uint32_t *args, uint32_t num_args, bool pure)
{
	if (forced_temporaries.find(id) != end(forced_temporaries))
		return false;

	for (uint32_t i = 0; i < num_args; i++)
		if (!should_forward(args[i]))
			return false;

	// We need to forward globals as well.
	if (!pure)
	{
		for (auto global : global_variables)
			if (!should_forward(global))
				return false;
		for (auto aliased : aliased_variables)
			if (!should_forward(aliased))
				return false;
	}

	return true;
}